

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O1

Quaternion * AML::dcm2Quat(Quaternion *__return_storage_ptr__,Matrix33 *dcm)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  bVar1 = isValidDCM(dcm,0.0001);
  if (bVar1) {
    dVar10 = (dcm->field_0).data[0][0];
    dVar14 = (dcm->field_0).data[0][1];
    dVar2 = dVar10 + 1.0;
    dVar4 = (dcm->field_0).data[1][1];
    dVar6 = (dcm->field_0).data[2][2];
    dVar5 = dVar2 + dVar4 + dVar6;
    dVar3 = (dVar2 - dVar4) - dVar6;
    dVar10 = 1.0 - dVar10;
    dVar7 = (dVar10 + dVar4) - dVar6;
    dVar6 = (dVar10 - dVar4) + dVar6;
    dVar10 = (dcm->field_0).data[1][2];
    dVar4 = (dcm->field_0).data[2][1];
    dVar2 = (dcm->field_0).data[2][0];
    dVar9 = (dcm->field_0).data[0][2];
    dVar12 = (dcm->field_0).data[1][0];
    dVar11 = dVar10 - dVar4;
    dVar8 = dVar2 - dVar9;
    dVar13 = dVar14 - dVar12;
    if (((dVar5 < dVar3) || (dVar5 < dVar7)) || (dVar5 < dVar6)) {
      dVar2 = dVar2 + dVar9;
      dVar14 = dVar14 + dVar12;
      if (((dVar3 < dVar5) || (dVar3 < dVar7)) || (dVar3 < dVar6)) {
        dVar10 = dVar10 + dVar4;
        if (((dVar7 < dVar5) || (dVar7 < dVar3)) || (dVar7 < dVar6)) {
          dVar14 = 0.0;
          if ((dVar6 < dVar5) || (dVar6 < dVar3)) {
            dVar9 = 0.0;
            dVar12 = 0.0;
            dVar4 = 0.0;
          }
          else {
            dVar9 = 0.0;
            dVar12 = 0.0;
            dVar4 = 0.0;
            if (dVar7 <= dVar6) {
              if (dVar6 < 0.0) {
                dVar6 = sqrt(dVar6);
              }
              else {
                dVar6 = SQRT(dVar6);
              }
              dVar4 = (dVar13 * 0.5) / dVar6;
              dVar12 = (dVar2 * 0.5) / dVar6;
              dVar9 = (dVar10 * 0.5) / dVar6;
              dVar14 = dVar6 * 0.5;
            }
          }
        }
        else {
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          dVar4 = (dVar8 * 0.5) / dVar7;
          dVar12 = (dVar14 * 0.5) / dVar7;
          dVar9 = dVar7 * 0.5;
          dVar14 = (dVar10 * 0.5) / dVar7;
        }
      }
      else {
        if (dVar3 < 0.0) {
          dVar3 = sqrt(dVar3);
        }
        else {
          dVar3 = SQRT(dVar3);
        }
        dVar4 = (dVar11 * 0.5) / dVar3;
        dVar12 = dVar3 * 0.5;
        dVar9 = (dVar14 * 0.5) / dVar3;
        dVar14 = (dVar2 * 0.5) / dVar3;
      }
    }
    else {
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      dVar4 = dVar5 * 0.5;
      dVar12 = (dVar11 * 0.5) / dVar5;
      dVar9 = (dVar8 * 0.5) / dVar5;
      dVar14 = (dVar13 * 0.5) / dVar5;
    }
    (__return_storage_ptr__->field_0).data[0] = dVar4;
    (__return_storage_ptr__->field_0).data[1] = dVar12;
    (__return_storage_ptr__->field_0).data[2] = dVar9;
    (__return_storage_ptr__->field_0).data[3] = dVar14;
  }
  else {
    (__return_storage_ptr__->field_0).data[0] = 1.0;
    (__return_storage_ptr__->field_0).data[1] = 0.0;
    (__return_storage_ptr__->field_0).data[2] = 0.0;
    (__return_storage_ptr__->field_0).data[3] = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

Quaternion dcm2Quat(const Matrix33& dcm)
    {
        const double TOL = 0.0001;

        // Check if DCM is Valid
        if (isValidDCM(dcm, TOL))
        {
            double q0 = 0.0;
            double q1 = 0.0;
            double q2 = 0.0;
            double q3 = 0.0;
            const double x4q0_2 = (1.0 + dcm.m11 + dcm.m22 + dcm.m33);
            const double x4q1_2 = (1.0 + dcm.m11 - dcm.m22 - dcm.m33);
            const double x4q2_2 = (1.0 - dcm.m11 + dcm.m22 - dcm.m33);
            const double x4q3_2 = (1.0 - dcm.m11 - dcm.m22 + dcm.m33);
            const double x4q2q3 = dcm.m23 + dcm.m32;
            const double x4q1q3 = dcm.m31 + dcm.m13;
            const double x4q1q2 = dcm.m12 + dcm.m21;
            const double x4q0q1 = dcm.m23 - dcm.m32;
            const double x4q0q2 = dcm.m31 - dcm.m13;
            const double x4q0q3 = dcm.m12 - dcm.m21;

            // Check which Trace is Largest
            if (x4q0_2 >= x4q1_2 && x4q0_2 >= x4q2_2 && x4q0_2 >= x4q3_2) // 4q0_2 Largest
            {
                const double x2q0 = sqrt(x4q0_2);
                q0 = 0.5 * x2q0;
                q1 = 0.5 * x4q0q1 / x2q0;
                q2 = 0.5 * x4q0q2 / x2q0;
                q3 = 0.5 * x4q0q3 / x2q0;
            }
            else if (x4q1_2 >= x4q0_2 && x4q1_2 >= x4q2_2 && x4q1_2 >= x4q3_2) // 4q1_2 Largest
            {
                const double x2q1 = sqrt(x4q1_2);
                q0 = 0.5 * x4q0q1 / x2q1;
                q1 = 0.5 * x2q1;
                q2 = 0.5 * x4q1q2 / x2q1;
                q3 = 0.5 * x4q1q3 / x2q1;
            }
            else if (x4q2_2 >= x4q0_2 && x4q2_2 >= x4q1_2 && x4q2_2 >= x4q3_2) // 4q2_2 Largest
            {
                const double x2q2 = sqrt(x4q2_2);
                q0 = 0.5 * x4q0q2 / x2q2;
                q1 = 0.5 * x4q1q2 / x2q2;
                q2 = 0.5 * x2q2;
                q3 = 0.5 * x4q2q3 / x2q2;
            }
            else if (x4q3_2 >= x4q0_2 && x4q3_2 >= x4q1_2 && x4q3_2 >= x4q2_2) // 4q3_2 Largest
            {
                const double x2q3 = sqrt(x4q3_2);
                q0 = 0.5 * x4q0q3 / x2q3;
                q1 = 0.5 * x4q1q3 / x2q3;
                q2 = 0.5 * x4q2q3 / x2q3;
                q3 = 0.5 * x2q3;
            }
            return Quaternion(q0, q1, q2, q3);
        }
        return Quaternion::identity();
    }